

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_setup_conn(Curl_easy *data,_Bool *protocol_done)

{
  connectdata *conn_00;
  curltime cVar1;
  undefined4 uStack_44;
  connectdata *conn;
  CURLcode result;
  _Bool *protocol_done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn_00 = data->conn;
  Curl_pgrsTime(data,TIMER_NAMELOOKUP);
  if ((conn_00->handler->flags & 0x10) == 0) {
    conn_00->bits = (ConnectBits)((uint)conn_00->bits & 0xffffffef);
    (data->state).crlf_conversions = 0;
    cVar1 = Curl_now();
    (conn_00->now).tv_sec = cVar1.tv_sec;
    *(ulong *)&(conn_00->now).tv_usec = CONCAT44(uStack_44,cVar1.tv_usec);
    if (((uint)conn_00->bits >> 7 & 1) == 0) {
      conn._4_4_ = Curl_conn_setup(data,conn_00,0,conn_00->dns_entry,-1);
    }
    *protocol_done = false;
    data_local._4_4_ = conn._4_4_;
  }
  else {
    *protocol_done = true;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_setup_conn(struct Curl_easy *data,
                         bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  Curl_pgrsTime(data, TIMER_NAMELOOKUP);

  if(conn->handler->flags & PROTOPT_NONETWORK) {
    /* nothing to setup when not using a network */
    *protocol_done = TRUE;
    return result;
  }

#ifndef CURL_DISABLE_PROXY
  /* set proxy_connect_closed to false unconditionally already here since it
     is used strictly to provide extra information to a parent function in the
     case of proxy CONNECT failures and we must make sure we don't have it
     lingering set from a previous invoke */
  conn->bits.proxy_connect_closed = FALSE;
#endif

#ifdef CURL_DO_LINEEND_CONV
  data->state.crlf_conversions = 0; /* reset CRLF conversion counter */
#endif /* CURL_DO_LINEEND_CONV */

  /* set start time here for timeout purposes in the connect procedure, it
     is later set again for the progress meter purpose */
  conn->now = Curl_now();
  if(!conn->bits.reuse)
    result = Curl_conn_setup(data, conn, FIRSTSOCKET, conn->dns_entry,
                             CURL_CF_SSL_DEFAULT);
  /* not sure we need this flag to be passed around any more */
  *protocol_done = FALSE;
  return result;
}